

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O3

void __thiscall lunasvg::Element::render(Element *this,Bitmap *bitmap,Matrix *matrix)

{
  SVGNode *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<lunasvg::Canvas> canvas;
  Canvas local_78;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined4 local_40;
  plutovg_surface_t *local_38;
  plutovg_canvas_t *local_30;
  Transform local_28;
  
  if (((this->super_Node).m_node != (SVGNode *)0x0) &&
     (bitmap->m_surface != (plutovg_surface_t *)0x0)) {
    Canvas::create(&local_78,bitmap);
    Transform::Transform(&local_28,matrix);
    if (local_78.m_canvas != (plutovg_canvas_t *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_78.m_canvas)->surface = *(int *)&(local_78.m_canvas)->surface + 1;
        UNLOCK();
      }
      else {
        *(int *)&(local_78.m_canvas)->surface = *(int *)&(local_78.m_canvas)->surface + 1;
      }
    }
    local_78.m_x = 0;
    local_78.m_y = 0;
    uStack_60 = 0;
    local_58 = local_28.m_matrix.a;
    fStack_54 = local_28.m_matrix.b;
    fStack_50 = local_28.m_matrix.c;
    fStack_4c = local_28.m_matrix.d;
    local_48 = local_28.m_matrix.e;
    fStack_44 = local_28.m_matrix.f;
    local_40 = 0;
    local_38 = local_78.m_surface;
    local_30 = local_78.m_canvas;
    pSVar1 = (this->super_Node).m_node;
    if (pSVar1 != (SVGNode *)0x0) {
      SVGRootElement::updateLayout
                ((SVGRootElement *)
                 (pSVar1->m_document->m_rootElement)._M_t.
                 super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
                 .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>);
    }
    (*pSVar1->_vptr_SVGNode[0x11])(pSVar1,&local_78.m_x);
    if (local_30 != (plutovg_canvas_t *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
    }
    if (local_78.m_canvas != (plutovg_canvas_t *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.m_canvas);
    }
  }
  return;
}

Assistant:

void Element::render(Bitmap& bitmap, const Matrix& matrix) const
{
    if(m_node == nullptr || bitmap.isNull())
        return;
    auto canvas = Canvas::create(bitmap);
    SVGRenderState state(nullptr, nullptr, matrix, SVGRenderMode::Painting, canvas);
    element(true)->render(state);
}